

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O2

void __thiscall f8n::prefs::Preferences::Save(Preferences *this)

{
  FILE *__s;
  runtime_error *this_00;
  bool in_DL;
  allocator<char> local_d1;
  string_t local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  char *local_30 [4];
  
  if (this->mode != ModeTransient) {
    if (this->mode == ModeReadOnly) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"cannot save a ModeReadOnly Preference!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    env::GetDataDirectory_abi_cxx11_(&local_50,(env *)0x1,in_DL);
    std::operator+(&local_b0,&local_50,"/");
    std::operator+(&local_90,&local_b0,&this->component);
    std::operator+(&local_70,&local_90,".json");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::dump(&local_d0,&this->json,2,' ',false,strict);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"wb",&local_d1);
    __s = fopen(local_70._M_dataplus._M_p,local_30[0]);
    std::__cxx11::string::~string((string *)local_30);
    if (__s != (FILE *)0x0) {
      fwrite(local_d0._M_dataplus._M_p,local_d0._M_string_length,1,__s);
      fclose(__s);
    }
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void Preferences::Save() {
    if (this->mode == ModeReadOnly) {
        throw std::runtime_error("cannot save a ModeReadOnly Preference!");
    }
    else if (this->mode != ModeTransient) {
        stringToFile(FILENAME(this->component), this->json.dump(2));
    }
}